

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O2

bool __thiscall spvtools::opt::AggressiveDCEPass::EliminateDeadFunctions(AggressiveDCEPass *this)

{
  size_type sVar1;
  Module *pMVar2;
  bool bVar3;
  iterator iVar4;
  iterator local_98;
  _Head_base<0UL,_spvtools::opt::Function_*,_false> local_88;
  _Any_data local_80;
  code *local_70;
  code *local_68;
  unordered_set<const_spvtools::opt::Function_*,_std::hash<const_spvtools::opt::Function_*>,_std::equal_to<const_spvtools::opt::Function_*>,_std::allocator<const_spvtools::opt::Function_*>_>
  live_function_set;
  
  live_function_set._M_h._M_buckets = &live_function_set._M_h._M_single_bucket;
  live_function_set._M_h._M_bucket_count = 1;
  live_function_set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  live_function_set._M_h._M_element_count = 0;
  live_function_set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_80._8_8_ = 0;
  live_function_set._M_h._M_rehash_policy._M_next_resize = 0;
  live_function_set._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_68 = std::
             _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp:757:31)>
             ::_M_invoke;
  local_70 = std::
             _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp:757:31)>
             ::_M_manager;
  local_80._M_unused._M_object = &live_function_set._M_h;
  IRContext::ProcessReachableCallTree
            ((this->super_MemPass).super_Pass.context_,(ProcessFunction *)&local_80);
  pMVar2 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  local_98.container_ = &pMVar2->functions_;
  iVar4.iterator_._M_current =
       *(unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_> **)
        &(pMVar2->functions_).
         super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
         ._M_impl;
  iVar4.container_ = local_98.container_;
  bVar3 = false;
  while( true ) {
    local_98.iterator_ = iVar4.iterator_._M_current;
    if ((iVar4.container_ == &pMVar2->functions_) &&
       (local_98.iterator_._M_current ==
        *(pointer *)
         ((long)&(pMVar2->functions_).
                 super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                 ._M_impl + 8))) break;
    local_88._M_head_impl =
         ((local_98.iterator_._M_current)->_M_t).
         super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
         .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl;
    sVar1 = std::
            _Hashtable<const_spvtools::opt::Function_*,_const_spvtools::opt::Function_*,_std::allocator<const_spvtools::opt::Function_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Function_*>,_std::hash<const_spvtools::opt::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&live_function_set._M_h,&local_88._M_head_impl);
    if (sVar1 == 0) {
      iVar4 = eliminatedeadfunctionsutil::EliminateFunction
                        ((this->super_MemPass).super_Pass.context_,&local_98);
      local_98.container_ = iVar4.container_;
      bVar3 = true;
    }
    else {
      iVar4.iterator_._M_current = local_98.iterator_._M_current + 1;
      iVar4.container_ = local_98.container_;
    }
    pMVar2 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  }
  if (local_70 != (code *)0x0) {
    (*local_70)(&local_80,&local_80,__destroy_functor);
  }
  std::
  _Hashtable<const_spvtools::opt::Function_*,_const_spvtools::opt::Function_*,_std::allocator<const_spvtools::opt::Function_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Function_*>,_std::hash<const_spvtools::opt::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&live_function_set._M_h);
  return bVar3;
}

Assistant:

bool AggressiveDCEPass::EliminateDeadFunctions() {
  // Identify live functions first. Those that are not live
  // are dead.
  std::unordered_set<const Function*> live_function_set;
  ProcessFunction mark_live = [&live_function_set](Function* fp) {
    live_function_set.insert(fp);
    return false;
  };
  context()->ProcessReachableCallTree(mark_live);

  bool modified = false;
  for (auto funcIter = get_module()->begin();
       funcIter != get_module()->end();) {
    if (live_function_set.count(&*funcIter) == 0) {
      modified = true;
      funcIter =
          eliminatedeadfunctionsutil::EliminateFunction(context(), &funcIter);
    } else {
      ++funcIter;
    }
  }

  return modified;
}